

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessBr
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  uint64_t aNid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pBVar4;
  pointer pNVar5;
  json_value jVar6;
  bool bVar7;
  Status SVar8;
  __type_conflict1 _Var9;
  int iVar10;
  int iVar11;
  uint aValue;
  ulong uVar12;
  Error *pEVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  Value *pVVar15;
  char *pcVar16;
  reference aJson;
  event_base *event_base;
  int *piVar17;
  ssize_t sVar18;
  pointer pbVar19;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var20;
  char *pcVar21;
  pointer pbVar22;
  long lVar23;
  pointer pBVar24;
  string *psVar25;
  pointer pBVar26;
  __normal_iterator<ot::commissioner::BorderAgent_*,_std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>_>
  _Var27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  Interpreter *this_00;
  json *this_01;
  Interpreter *pIVar29;
  string_t *psVar30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar31;
  pointer pBVar32;
  __normal_iterator<ot::commissioner::BorderAgent_*,_std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>_>
  __it;
  string *psVar33;
  pointer pNVar34;
  long lVar35;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  format_args args_15;
  format_args args_16;
  format_args args_17;
  format_args args_18;
  format_args args_19;
  format_args args_20;
  format_args args_21;
  format_args args_22;
  format_args args_23;
  format_args args_24;
  format_args args_25;
  json ba_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48c0;
  code *local_48b0;
  code *local_48a8;
  Interpreter *local_4890;
  undefined1 local_4888 [40];
  parse_func local_4860;
  code *local_4858;
  StringArray unresolved;
  FDGuard fdgMdnsSocket;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  routers;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4800;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  networks;
  thread selectThread;
  uint32_t scanTimeout;
  vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_> agents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  json json;
  writer write_16;
  writer write;
  json json_1;
  json baJson;
  unique_ptr<event,_void_(*)(event_*)> cancelEvent;
  string_t local_4708;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_46e8;
  string local_46d8;
  string_t local_46b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_4698;
  undefined1 local_4688 [40];
  undefined1 local_4660 [40];
  _Any_data local_4638;
  undefined8 local_4628;
  undefined8 uStack_4620;
  undefined1 local_4618 [40];
  undefined1 local_45f0 [40];
  undefined1 local_45c8 [40];
  undefined1 local_45a0 [40];
  undefined1 local_4578 [64];
  undefined1 local_4538 [64];
  undefined1 local_44f8 [64];
  string local_44b8;
  undefined1 local_4498 [40];
  undefined1 local_4470 [40];
  undefined1 local_4448 [40];
  undefined1 local_4420 [40];
  undefined1 local_43f8 [40];
  undefined1 local_43d0 [40];
  undefined1 local_43a8 [40];
  undefined1 local_4380 [40];
  undefined1 local_4358 [40];
  undefined1 local_4330 [40];
  undefined1 local_4308 [40];
  undefined1 local_42e0 [40];
  undefined1 local_42b8 [40];
  undefined1 local_4290 [40];
  undefined1 local_4268 [80];
  undefined1 local_4218 [40];
  undefined1 local_41f0 [40];
  undefined1 local_41c8 [160];
  undefined1 local_4128 [40];
  undefined1 local_4100 [40];
  undefined1 local_40d8 [40];
  undefined1 local_40b0 [40];
  undefined1 local_4088 [40];
  undefined1 local_4060 [40];
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  domNetworks;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar19 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_4890 = this;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19) < 0x21) {
    ba_2._0_8_ = ba_2._0_8_ & 0xffffffff00000000;
    ba_2.m_value.object = (object_t *)anon_var_dwarf_29eef0;
    local_48c0._M_allocated_capacity = 0;
    local_48b0 = (code *)0x0;
    pcVar16 = "too few arguments";
    local_48c0._8_8_ = (pointer)&ba_2;
    while (pcVar21 = pcVar16, pcVar21 != "") {
      pcVar16 = pcVar21 + 1;
      if (*pcVar21 == '}') {
        if ((pcVar16 == "") || (*pcVar16 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar16 = pcVar21 + 2;
      }
      else if (*pcVar21 == '{') {
        pcVar16 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar21,"",(format_string_checker<char> *)&ba_2);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&ba_2;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_4888,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    psVar25 = (string *)(local_4060 + 8);
    local_4060._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar25,(string *)local_4888);
    Value::Value((Value *)&domNetworks,(Error *)local_4060);
LAB_001f18c3:
    Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
    Value::~Value((Value *)&domNetworks);
    std::__cxx11::string::~string(psVar25);
    std::__cxx11::string::~string((string *)local_4888);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&domNetworks,"list",(allocator *)&ba_2);
  bVar7 = CaseInsensitiveEqual(pbVar19 + 1,(string *)&domNetworks);
  std::__cxx11::string::~string((string *)&domNetworks);
  if (bVar7) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&json,(nullptr_t)0x0);
    routers.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    routers.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    routers.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    networks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    networks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    networks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((long)(aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x40) {
      pbVar19 = (local_4890->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar22 = (local_4890->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar22 == pbVar19) {
        if ((local_4890->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (local_4890->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          SVar8 = persistent_storage::Registry::GetAllBorderRouters
                            ((local_4890->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&routers);
          if (kNotFound < SVar8) {
            ba_2._0_8_ = ba_2._0_8_ & 0xffffffff00000000;
            ba_2.m_value.object = (object_t *)anon_var_dwarf_29ed1e;
            local_48c0._M_allocated_capacity = 0;
            local_48b0 = (code *)0x0;
            pcVar16 = "lookup failed";
            local_48c0._8_8_ = (pointer)&ba_2;
            while (pcVar21 = pcVar16, pcVar21 != "") {
              pcVar16 = pcVar21 + 1;
              if (*pcVar21 == '}') {
                if ((pcVar16 == "") || (*pcVar16 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar16 = pcVar21 + 2;
              }
              else if (*pcVar21 == '{') {
                pcVar16 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                    (pcVar21,"",(format_string_checker<char> *)&ba_2);
              }
            }
            args_06.field_1.values_ = in_R9.values_;
            args_06.desc_ = (unsigned_long_long)&ba_2;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4888,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_06
                      );
            psVar25 = (string *)(local_40d8 + 8);
            local_40d8._0_4_ = kRegistryError;
            std::__cxx11::string::string(psVar25,(string *)local_4888);
            Value::Value((Value *)&domNetworks,(Error *)local_40d8);
            goto LAB_001f1bfd;
          }
        }
        else {
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SVar8 = persistent_storage::Registry::GetNetworksByAliases
                            ((local_4890->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(StringArray *)local_4890,&networks,&unresolved);
          if (SVar8 != kSuccess) {
            ba_2._0_8_ = ba_2._0_8_ & 0xffffffff00000000;
            ba_2.m_value.object = (object_t *)anon_var_dwarf_29ed1e;
            local_48c0._M_allocated_capacity = 0;
            local_48b0 = (code *)0x0;
            pcVar16 = "lookup failed";
            local_48c0._8_8_ = (pointer)&ba_2;
            while (pcVar21 = pcVar16, pcVar21 != "") {
              pcVar16 = pcVar21 + 1;
              if (*pcVar21 == '}') {
                if ((pcVar16 == "") || (*pcVar16 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar16 = pcVar21 + 2;
              }
              else if (*pcVar21 == '{') {
                pcVar16 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                    (pcVar21,"",(format_string_checker<char> *)&ba_2);
              }
            }
            args_05.field_1.values_ = in_R9.values_;
            args_05.desc_ = (unsigned_long_long)&ba_2;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4888,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_05
                      );
            local_40b0._0_4_ = kRegistryError;
            std::__cxx11::string::string((string *)(local_40b0 + 8),(string *)local_4888);
            Value::Value((Value *)&domNetworks,(Error *)local_40b0);
            Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
            Value::~Value((Value *)&domNetworks);
            std::__cxx11::string::~string((string *)(local_40b0 + 8));
            std::__cxx11::string::~string((string *)local_4888);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&unresolved);
            goto LAB_001f27d7;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&unresolved);
        }
      }
      else {
        pIVar29 = (Interpreter *)(local_44f8 + 0x20);
        for (; pbVar19 != pbVar22; pbVar19 = pbVar19 + 1) {
          domNetworks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          domNetworks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          domNetworks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          SVar8 = persistent_storage::Registry::GetNetworksInDomain
                            ((local_4890->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,pbVar19,&domNetworks);
          if (SVar8 == kSuccess) {
            std::
            vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
            ::
            insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,void>
                      ((vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
                        *)&networks,
                       (const_iterator)
                       networks.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                        )domNetworks.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                        )domNetworks.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            std::__cxx11::string::string((string *)&local_44b8,(string *)pbVar19);
            this_00 = pIVar29;
            std::__cxx11::string::string((string *)pIVar29,"domain name unknown",(allocator *)&ba_2)
            ;
            PrintNetworkMessage(this_00,&local_44b8,(string *)pIVar29,kYellow);
            std::__cxx11::string::~string((string *)pIVar29);
            std::__cxx11::string::~string((string *)&local_44b8);
          }
          std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::~vector(&domNetworks);
        }
      }
      pNVar5 = networks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        for (pNVar34 = networks.
                       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                       ._M_impl.super__Vector_impl_data._M_start; pNVar34 != pNVar5;
            pNVar34 = pNVar34 + 1) {
          domNetworks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          domNetworks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          domNetworks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          SVar8 = persistent_storage::Registry::GetBorderRoutersInNetwork
                            ((local_4890->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,pNVar34->mXpan,
                             (vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              *)&domNetworks);
          if (SVar8 == kSuccess) {
            std::
            vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>
            ::
            insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::BorderRouter*,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>>,void>
                      ((vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>
                        *)&routers,
                       (const_iterator)
                       routers.
                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                        )domNetworks.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                        )domNetworks.
                         super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            aNid = pNVar34->mXpan;
            pIVar29 = (Interpreter *)local_44f8;
            std::__cxx11::string::string((string *)local_44f8,"lookup failed",(allocator *)&ba_2);
            PrintNetworkMessage(pIVar29,aNid,(string *)local_44f8,kYellow);
            std::__cxx11::string::~string((string *)local_44f8);
          }
          std::
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     *)&domNetworks);
        }
      }
      if (routers.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          routers.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::string((string *)&local_46d8,"[]",(allocator *)&ba_2);
        Value::Value((Value *)&domNetworks,&local_46d8);
        Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
        Value::~Value((Value *)&domNetworks);
        psVar30 = &local_46d8;
      }
      else {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_&,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>,_0>
                  (&local_4698,&routers);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(&json,&local_4698);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_4698);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(&local_46b8,&json,4,' ',false,strict);
        Value::Value((Value *)&domNetworks,&local_46b8);
        Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
        Value::~Value((Value *)&domNetworks);
        psVar30 = &local_46b8;
      }
    }
    else {
      ba_2._0_8_ = ba_2._0_8_ & 0xffffffff00000000;
      ba_2.m_value.object = (object_t *)anon_var_dwarf_2a462f;
      local_48c0._M_allocated_capacity = 0;
      local_48b0 = (code *)0x0;
      pcVar16 = "too many arguments";
      local_48c0._8_8_ = (pointer)&ba_2;
      while (pcVar21 = pcVar16, pcVar21 != "") {
        pcVar16 = pcVar21 + 1;
        if (*pcVar21 == '}') {
          if ((pcVar16 == "") || (*pcVar16 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar16 = pcVar21 + 2;
        }
        else if (*pcVar21 == '{') {
          pcVar16 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar21,"",(format_string_checker<char> *)&ba_2);
        }
      }
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&ba_2;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_4888,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_00
                );
      psVar25 = (string *)(local_4088 + 8);
      local_4088._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(psVar25,(string *)local_4888);
      Value::Value((Value *)&domNetworks,(Error *)local_4088);
LAB_001f1bfd:
      Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
      Value::~Value((Value *)&domNetworks);
      std::__cxx11::string::~string(psVar25);
      psVar30 = (string_t *)local_4888;
    }
    std::__cxx11::string::~string((string *)psVar30);
LAB_001f27d7:
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::~vector(&networks);
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::~vector(&routers);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&json);
    return __return_storage_ptr__;
  }
  pbVar19 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&domNetworks,"add",(allocator *)&ba_2);
  bVar7 = CaseInsensitiveEqual(pbVar19 + 1,(string *)&domNetworks);
  std::__cxx11::string::~string((string *)&domNetworks);
  if (!bVar7) {
    pbVar19 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&domNetworks,"delete",(allocator *)&ba_2);
    bVar7 = CaseInsensitiveEqual(pbVar19 + 1,(string *)&domNetworks);
    std::__cxx11::string::~string((string *)&domNetworks);
    if (bVar7) {
      uVar12 = (long)(aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      routers.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&ba_2;
      if (uVar12 < 0x61) {
        if (uVar12 != 0x60) {
          if ((local_4890->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (local_4890->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            psVar33 = (local_4890->mContext).mDomAliases.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((local_4890->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish == psVar33) {
              return __return_storage_ptr__;
            }
            routers.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            routers.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            routers.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            SVar8 = persistent_storage::Registry::DeleteBorderRoutersInDomain
                              ((local_4890->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,psVar33);
            if (SVar8 != kSuccess) {
              if (SVar8 == kRestricted) {
                ba_2._0_4_ = 0xd;
                ba_2.m_value.object = (object_t *)anon_var_dwarf_2a5174;
                local_48c0._M_allocated_capacity = 0x100000000;
                local_48b0 = ::fmt::v10::detail::
                             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                ;
                pcVar16 = 
                "Failed to delete border routers in the domain \'{}\' of the current network";
                local_48c0._8_8_ = (pointer)&ba_2;
                networks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&ba_2;
                while (pcVar16 != "") {
                  cVar1 = *pcVar16;
                  pcVar21 = pcVar16;
                  while (cVar1 != '{') {
                    pcVar21 = pcVar21 + 1;
                    if (pcVar21 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()((writer *)&networks,pcVar16,"");
                      goto LAB_001f3a1f;
                    }
                    cVar1 = *pcVar21;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&networks,pcVar16,pcVar21);
                  pcVar16 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                      (pcVar21,"",
                                       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&ba_2);
                }
LAB_001f3a1f:
                pbVar19 = (local_4890->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ba_2._0_8_ = (pbVar19->_M_dataplus)._M_p;
                ba_2.m_value = (json_value)pbVar19->_M_string_length;
                fmt_05.size_ = 0xd;
                fmt_05.data_ = (char *)0x49;
                args_17.field_1.values_ = in_R9.values_;
                args_17.desc_ = (unsigned_long_long)&ba_2;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_4888,
                           (v10 *)
                           "Failed to delete border routers in the domain \'{}\' of the current network"
                           ,fmt_05,args_17);
                psVar25 = (string *)(local_4308 + 8);
                local_4308._0_4_ = kRegistryError;
                std::__cxx11::string::string(psVar25,(string *)local_4888);
                Value::Value((Value *)&domNetworks,(Error *)local_4308);
              }
              else {
                ba_2._0_4_ = 0xd;
                ba_2.m_value.object = (object_t *)anon_var_dwarf_2a5181;
                local_48c0._M_allocated_capacity = 0x100000000;
                local_48b0 = ::fmt::v10::detail::
                             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                ;
                pcVar16 = "Failed to delete border routers in the domain \'{}\'";
                local_48c0._8_8_ = (pointer)&ba_2;
                networks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&ba_2;
                while (pcVar16 != "") {
                  cVar1 = *pcVar16;
                  pcVar21 = pcVar16;
                  while (cVar1 != '{') {
                    pcVar21 = pcVar21 + 1;
                    if (pcVar21 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()((writer *)&networks,pcVar16,"");
                      goto LAB_001f3a95;
                    }
                    cVar1 = *pcVar21;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&networks,pcVar16,pcVar21);
                  pcVar16 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                      (pcVar21,"",
                                       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&ba_2);
                }
LAB_001f3a95:
                pbVar19 = (local_4890->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ba_2._0_8_ = (pbVar19->_M_dataplus)._M_p;
                ba_2.m_value = (json_value)pbVar19->_M_string_length;
                fmt_06.size_ = 0xd;
                fmt_06.data_ = (char *)0x32;
                args_18.field_1.args_ = in_R9.args_;
                args_18.desc_ = (unsigned_long_long)&ba_2;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_4888,
                           (v10 *)"Failed to delete border routers in the domain \'{}\'",fmt_06,
                           args_18);
                psVar25 = (string *)(local_4330 + 8);
                local_4330._0_4_ = kRegistryError;
                std::__cxx11::string::string(psVar25,(string *)local_4888);
                Value::Value((Value *)&domNetworks,(Error *)local_4330);
              }
              Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
              Value::~Value((Value *)&domNetworks);
              std::__cxx11::string::~string(psVar25);
              std::__cxx11::string::~string((string *)local_4888);
            }
          }
          else {
            routers.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            routers.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            routers.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            SVar8 = persistent_storage::Registry::DeleteBorderRoutersInNetworks
                              ((local_4890->mRegistry).
                               super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,(StringArray *)local_4890,(StringArray *)&routers);
            if (SVar8 != kSuccess) {
              if (SVar8 == kRestricted) {
                ba_2._0_8_ = ba_2._0_8_ & 0xffffffff00000000;
                ba_2.m_value.object = (object_t *)anon_var_dwarf_2a5167;
                local_48c0._M_allocated_capacity = 0;
                local_48b0 = (code *)0x0;
                pcVar16 = "Can\'t delete all border routers from the current network";
                local_48c0._8_8_ = (pointer)&ba_2;
                networks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)&ba_2;
                while (pcVar16 != "") {
                  cVar1 = *pcVar16;
                  pcVar21 = pcVar16;
                  while (cVar1 != '{') {
                    pcVar21 = pcVar21 + 1;
                    if (pcVar21 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>
                      ::writer::operator()((writer *)&networks,pcVar16,"");
                      goto LAB_001f31ed;
                    }
                    cVar1 = *pcVar21;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()((writer *)&networks,pcVar16,pcVar21);
                  pcVar16 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                      (pcVar21,"",(format_string_checker<char> *)&ba_2);
                }
LAB_001f31ed:
                args_11.field_1.args_ = in_R9.args_;
                args_11.desc_ = (unsigned_long_long)&ba_2;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_4888,
                           (v10 *)"Can\'t delete all border routers from the current network",
                           (string_view)ZEXT816(0x38),args_11);
                local_42b8._0_4_ = kRegistryError;
                std::__cxx11::string::string((string *)(local_42b8 + 8),(string *)local_4888);
                Value::Value((Value *)&domNetworks,(Error *)local_42b8);
                Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
                Value::~Value((Value *)&domNetworks);
                std::__cxx11::string::~string((string *)(local_42b8 + 8));
                this_01 = (json *)local_4888;
              }
              else {
                std::__cxx11::string::string
                          ((string *)&ba_2,"Failed to delete border routers",(allocator *)local_4888
                          );
                local_42e0._0_4_ = kIOError;
                std::__cxx11::string::string((string *)(local_42e0 + 8),(string *)&ba_2);
                Value::Value((Value *)&domNetworks,(Error *)local_42e0);
                Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
                Value::~Value((Value *)&domNetworks);
                std::__cxx11::string::~string((string *)(local_42e0 + 8));
                this_01 = &ba_2;
              }
              std::__cxx11::string::~string((string *)this_01);
            }
            pBVar4 = routers.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            psVar33 = (string *)(local_4538 + 0x20);
            for (pBVar24 = routers.
                           super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                           ._M_impl.super__Vector_impl_data._M_start; pBVar24 != pBVar4;
                pBVar24 = (pointer)&(pBVar24->mAgent).mAddr._M_string_length) {
              std::__cxx11::string::string((string *)psVar33,(string *)pBVar24);
              pIVar29 = (Interpreter *)local_4538;
              std::__cxx11::string::string
                        ((string *)local_4538,"failed to resolve",(allocator *)&domNetworks);
              PrintNetworkMessage(pIVar29,psVar33,(string *)local_4538,kYellow);
              std::__cxx11::string::~string((string *)local_4538);
              std::__cxx11::string::~string((string *)psVar33);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&routers);
          return __return_storage_ptr__;
        }
        if (((local_4890->mContext).mNwkAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (local_4890->mContext).mNwkAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((local_4890->mContext).mDomAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (local_4890->mContext).mDomAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          persistent_storage::BorderRouterId::BorderRouterId((BorderRouterId *)&networks);
          aValue = std::__cxx11::stoi((aExpr->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,
                                      10);
          persistent_storage::BorderRouterId::BorderRouterId((BorderRouterId *)&domNetworks,aValue);
          networks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(networks.
                                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 domNetworks.
                                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_4_);
          SVar8 = persistent_storage::Registry::DeleteBorderRouterById
                            ((local_4890->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(BorderRouterId *)&networks);
          if (SVar8 == kSuccess) {
            return __return_storage_ptr__;
          }
          if (SVar8 == kRestricted) {
            ba_2._0_4_ = 0xd;
            ba_2.m_value.object = (object_t *)anon_var_dwarf_2a514d;
            local_48c0._M_allocated_capacity = 0x100000000;
            local_48b0 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar16 = "Failed to delete border router ID {}: last router in the current network";
            local_48c0._8_8_ = (pointer)&ba_2;
            while (pcVar16 != "") {
              cVar1 = *pcVar16;
              pcVar21 = pcVar16;
              while (cVar1 != '{') {
                pcVar21 = pcVar21 + 1;
                if (pcVar21 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&routers,pcVar16,"");
                  goto LAB_001f3e8f;
                }
                cVar1 = *pcVar21;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&routers,pcVar16,pcVar21);
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                  (pcVar21,"",
                                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&ba_2);
            }
LAB_001f3e8f:
            pbVar19 = (aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            ba_2._0_8_ = pbVar19[2]._M_dataplus._M_p;
            ba_2.m_value = (json_value)pbVar19[2]._M_string_length;
            fmt_07.size_ = 0xd;
            fmt_07.data_ = (char *)0x48;
            args_20.field_1.values_ = in_R9.values_;
            args_20.desc_ = (unsigned_long_long)&ba_2;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4888,
                       (v10 *)
                       "Failed to delete border router ID {}: last router in the current network",
                       fmt_07,args_20);
            psVar25 = (string *)(local_4268 + 8);
            local_4268._0_4_ = kRegistryError;
            std::__cxx11::string::string(psVar25,(string *)local_4888);
            Value::Value((Value *)&domNetworks,(Error *)local_4268);
          }
          else {
            ba_2._0_4_ = 0xd;
            ba_2.m_value.object = (object_t *)anon_var_dwarf_2a515a;
            local_48c0._M_allocated_capacity = 0x100000000;
            local_48b0 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar16 = "Failed to delete border router ID {}";
            local_48c0._8_8_ = (pointer)&ba_2;
            while (pcVar16 != "") {
              cVar1 = *pcVar16;
              pcVar21 = pcVar16;
              while (cVar1 != '{') {
                pcVar21 = pcVar21 + 1;
                if (pcVar21 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&routers,pcVar16,"");
                  goto LAB_001f3f01;
                }
                cVar1 = *pcVar21;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&routers,pcVar16,pcVar21);
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                  (pcVar21,"",
                                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&ba_2);
            }
LAB_001f3f01:
            pbVar19 = (aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            ba_2._0_8_ = pbVar19[2]._M_dataplus._M_p;
            ba_2.m_value = (json_value)pbVar19[2]._M_string_length;
            fmt_08.size_ = 0xd;
            fmt_08.data_ = (char *)0x24;
            args_21.field_1.args_ = in_R9.args_;
            args_21.desc_ = (unsigned_long_long)&ba_2;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4888,(v10 *)"Failed to delete border router ID {}",fmt_08,
                       args_21);
            psVar25 = (string *)(local_4290 + 8);
            local_4290._0_4_ = kRegistryError;
            std::__cxx11::string::string(psVar25,(string *)local_4888);
            Value::Value((Value *)&domNetworks,(Error *)local_4290);
          }
          Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
          Value::~Value((Value *)&domNetworks);
          std::__cxx11::string::~string(psVar25);
          psVar25 = (string *)local_4888;
          goto LAB_001f3cfd;
        }
      }
      ba_2._0_8_ = ba_2._0_8_ & 0xffffffff00000000;
      ba_2.m_value.object = (object_t *)anon_var_dwarf_2a5133;
      local_48c0._M_allocated_capacity = 0;
      local_48b0 = (code *)0x0;
      pcVar16 = "Too many arguments for `br delete` command`";
      local_48c0._8_8_ = (pointer)&ba_2;
      while (pcVar16 != "") {
        cVar1 = *pcVar16;
        pcVar21 = pcVar16;
        while (cVar1 != '{') {
          pcVar21 = pcVar21 + 1;
          if (pcVar21 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&routers,pcVar16,"");
            goto LAB_001f20ab;
          }
          cVar1 = *pcVar21;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&routers,pcVar16,pcVar21);
        pcVar16 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar21,"",(format_string_checker<char> *)&ba_2);
      }
LAB_001f20ab:
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)&ba_2;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_4888,(v10 *)"Too many arguments for `br delete` command`",
                 (string_view)ZEXT816(0x2b),args_02);
      psVar25 = (string *)(local_4218 + 8);
      local_4218._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(psVar25,(string *)local_4888);
      Value::Value((Value *)&domNetworks,(Error *)local_4218);
      goto LAB_001f18c3;
    }
    pbVar19 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&domNetworks,"scan",(allocator *)&ba_2);
    bVar7 = CaseInsensitiveEqual(pbVar19 + 1,(string *)&domNetworks);
    std::__cxx11::string::~string((string *)&domNetworks);
    if (!bVar7) {
      ba_2._0_4_ = 0xd;
      ba_2.m_value.object = (object_t *)anon_var_dwarf_2a45e3;
      local_48c0._M_allocated_capacity = 0x100000000;
      local_48b0 = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar16 = "\'{}\' is not a valid sub-command";
      local_48c0._8_8_ = (pointer)&ba_2;
      while (pcVar21 = pcVar16, pcVar21 != "") {
        pcVar16 = pcVar21 + 1;
        if (*pcVar21 == '}') {
          if ((pcVar16 == "") || (*pcVar16 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar16 = pcVar21 + 2;
        }
        else if (*pcVar21 == '{') {
          pcVar16 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                              (pcVar21,"",
                               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&ba_2);
        }
      }
      pbVar19 = (aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ba_2._0_8_ = pbVar19[1]._M_dataplus._M_p;
      ba_2.m_value = (json_value)pbVar19[1]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      args_04.field_1.args_ = in_R9.args_;
      args_04.desc_ = (unsigned_long_long)&ba_2;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_4888,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_04);
      psVar25 = (string *)(local_4498 + 8);
      local_4498._0_4_ = kInvalidCommand;
      std::__cxx11::string::string(psVar25,(string *)local_4888);
      Value::Value((Value *)&domNetworks,(Error *)local_4498);
      goto LAB_001f18c3;
    }
    std::__cxx11::string::string((string *)&routers,"_meshcop._udp.local",(allocator *)&domNetworks)
    ;
    scanTimeout = 10000;
    std::__cxx11::string::string((string *)&networks,"",(allocator *)&domNetworks);
    fdgMdnsSocket.mFD = -1;
    selectThread._M_id._M_thread = (id)0;
    write.handler_ = (format_string_checker<char> *)event_free;
    cancelEvent._M_t.super___uniq_ptr_impl<event,_void_(*)(event_*)>._M_t.
    super__Tuple_impl<0UL,_event_*,_void_(*)(event_*)>.super__Tuple_impl<1UL,_void_(*)(event_*)>.
    super__Head_base<1UL,_void_(*)(event_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(event_*),_false>)event_free;
    cancelEvent._M_t.super___uniq_ptr_impl<event,_void_(*)(event_*)>._M_t.
    super__Tuple_impl<0UL,_event_*,_void_(*)(event_*)>.super__Head_base<0UL,_event_*,_false>.
    _M_head_impl = (event *)0x0;
    json.m_type = null;
    json._1_7_ = 0;
    json.m_value.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(&baJson,(nullptr_t)0x0);
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[10]>>
                       ((local_4890->mContext).mCommandKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (local_4890->mContext).mCommandKeys.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"--timeout");
    pbVar28 = (local_4890->mContext).mCommandKeys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var14._M_current == pbVar28) {
LAB_001f1e72:
      pIVar29 = local_4890;
      _Var14 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                         ((local_4890->mContext).mCommandKeys.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,pbVar28,"--netif");
      pbVar28 = (pIVar29->mContext).mCommandKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (_Var14._M_current != pbVar28) {
        if (_Var14._M_current + 1 == pbVar28) {
          local_4888._0_8_ = local_4888._0_8_ & 0xffffffff00000000;
          local_4888._8_8_ = "Missing --netif value";
          local_4888._16_8_ = (char *)0x15;
          local_4888._24_8_ = 0;
          local_4860 = (parse_func)0x0;
          pcVar16 = "Missing --netif value";
          local_4888._32_8_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4888;
          while (pcVar21 = pcVar16, pcVar21 != "") {
            pcVar16 = pcVar21 + 1;
            if (*pcVar21 == '}') {
              if ((pcVar16 == "") || (*pcVar16 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar16 = pcVar21 + 2;
            }
            else if (*pcVar21 == '{') {
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar21,"",(format_string_checker<char> *)local_4888);
            }
          }
          args_09.field_1.args_ = in_R9.args_;
          args_09.desc_ = (unsigned_long_long)local_4888;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&unresolved,(v10 *)"Missing --netif value",(string_view)ZEXT816(0x15)
                     ,args_09);
          psVar25 = (string *)(local_4380 + 8);
          local_4380._0_4_ = kInvalidArgs;
          std::__cxx11::string::string(psVar25,(string *)&unresolved);
          Value::Value((Value *)&ba_2,(Error *)local_4380);
          goto LAB_001f3c6b;
        }
        std::__cxx11::string::_M_assign((string *)&networks);
      }
      iVar10 = mdns_socket_open_ipv4();
      if (iVar10 < 0) {
        local_4888._0_8_ = (ulong)(uint)local_4888._4_4_ << 0x20;
        local_4888._8_8_ = "failed to open mDNS IPv4 socket";
        local_4888._16_8_ = (char *)0x1f;
        local_4888._24_8_ = 0;
        local_4860 = (parse_func)0x0;
        pcVar16 = "failed to open mDNS IPv4 socket";
        local_4888._32_8_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4888;
        while (pcVar21 = pcVar16, pcVar21 != "") {
          pcVar16 = pcVar21 + 1;
          if (*pcVar21 == '}') {
            if ((pcVar16 == "") || (*pcVar16 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar16 = pcVar21 + 2;
          }
          else if (*pcVar21 == '{') {
            pcVar16 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar21,"",(format_string_checker<char> *)local_4888);
          }
        }
        args_08.field_1.values_ = in_R9.values_;
        args_08.desc_ = (unsigned_long_long)local_4888;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&unresolved,(v10 *)"failed to open mDNS IPv4 socket",
                   (string_view)ZEXT816(0x1f),args_08);
        psVar25 = (string *)(local_43a8 + 8);
        local_43a8._0_4_ = kIOError;
        std::__cxx11::string::string(psVar25,(string *)&unresolved);
        Value::Value((Value *)&ba_2,(Error *)local_43a8);
      }
      else if ((networks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
              (iVar11 = setsockopt(iVar10,1,0x19,
                                   networks.
                                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (socklen_t)
                                   networks.
                                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                   ._M_impl.super__Vector_impl_data._M_finish), iVar11 == 0)) {
        fdgMdnsSocket.mFD = iVar10;
        event_base = event_base_new();
        json_1._0_8_ = (ulong)scanTimeout / 1000;
        json_1.m_value._0_4_ = (scanTimeout % 1000) * 1000;
        json_1.m_value.number_integer._4_4_ = 0;
        event_base_loopexit(event_base,(timeval *)&json_1);
        ba_2.m_value.object =
             (object_t *)
             event_new(event_base,iVar10,0x12,ProcessBr::anon_class_1_0_00000001::__invoke,&json);
        ba_2._0_8_ = event_free;
        std::__uniq_ptr_impl<event,_void_(*)(event_*)>::operator=
                  ((__uniq_ptr_impl<event,_void_(*)(event_*)> *)&write,
                   (__uniq_ptr_impl<event,_void_(*)(event_*)> *)&ba_2);
        std::unique_ptr<event,_void_(*)(event_*)>::~unique_ptr
                  ((unique_ptr<event,_void_(*)(event_*)> *)&ba_2);
        event_add((event *)0x0,(timeval *)0x0);
        ba_2.m_value.object =
             (object_t *)
             event_new(event_base,local_4890->mCancelPipe[0],0x12,
                       ProcessBr::anon_class_1_0_00000001::__invoke,event_base);
        ba_2._0_8_ = event_free;
        std::__uniq_ptr_impl<event,_void_(*)(event_*)>::operator=
                  ((__uniq_ptr_impl<event,_void_(*)(event_*)> *)&cancelEvent,
                   (__uniq_ptr_impl<event,_void_(*)(event_*)> *)&ba_2);
        std::unique_ptr<event,_void_(*)(event_*)>::~unique_ptr
                  ((unique_ptr<event,_void_(*)(event_*)> *)&ba_2);
        event_add(cancelEvent._M_t.super___uniq_ptr_impl<event,_void_(*)(event_*)>._M_t.
                  super__Tuple_impl<0UL,_event_*,_void_(*)(event_*)>.
                  super__Head_base<0UL,_event_*,_false>._M_head_impl,(timeval *)0x0);
        local_4888._0_8_ = (pointer)0x0;
        ba_2._0_8_ = operator_new(0x10);
        *(undefined ***)ba_2._0_8_ = &PTR___State_00348298;
        *(event_base **)(ba_2._0_8_ + 8) = event_base;
        std::thread::_M_start_thread(local_4888,&ba_2,0);
        if (ba_2._0_8_ != 0) {
          (**(code **)(*(long *)ba_2._0_8_ + 8))();
        }
        if (selectThread._M_id._M_thread != 0) {
          std::terminate();
        }
        selectThread._M_id._M_thread = (id)(id)local_4888._0_8_;
        local_4888._0_8_ = (pointer)0x0;
        std::thread::~thread((thread *)local_4888);
        aVar31 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )0x4000;
        iVar10 = mdns_query_send(iVar10,MDNS_RECORDTYPE_PTR,
                                 (char *)routers.
                                         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                 (size_t)routers.
                                         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&domNetworks,
                                 0x4000);
        if (iVar10 == 0) {
          std::thread::join();
          if (((local_4890->mCancelCommand)._M_base._M_i & 1U) == 0) {
            xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            agents.
            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            agents.
            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            agents.
            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((local_4890->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (local_4890->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001f41df:
              jVar6 = json.m_value;
              for (psVar33 = (string *)(json._0_8_ + 0x180);
                  (BorderAgent *)(psVar33 + -0xc) != (BorderAgent *)jVar6.object;
                  psVar33 = psVar33 + 0xd) {
                if (*(int *)((long)&psVar33[-1].field_2 + 8) == 0) {
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::basic_json(&ba_2,(nullptr_t)0x0);
                  BorderAgentToJson((BorderAgent *)(psVar33 + -0xc),&ba_2);
                  pbVar19 = (local_4890->mContext).mNwkAliases.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar22 = (local_4890->mContext).mNwkAliases.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  pbVar28 = (local_4890->mContext).mDomAliases.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar3 = (local_4890->mContext).mDomAliases.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  if (pbVar28 == pbVar3 && pbVar19 == pbVar22) {
LAB_001f4262:
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::push_back(&baJson,&ba_2);
                  }
                  else {
                    if ((pbVar28 != pbVar3) && ((psVar33[-1].field_2._M_local_buf[1] & 0x10U) != 0))
                    {
                      _Var9 = std::operator==(psVar33 + -3,pbVar28);
                      if (_Var9) goto LAB_001f4262;
                      pbVar19 = (local_4890->mContext).mNwkAliases.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pbVar22 = (local_4890->mContext).mNwkAliases.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    if (((pbVar19 != pbVar22) &&
                        ((psVar33[-1].field_2._M_local_buf[0] & 0x20U) != 0)) &&
                       (_Var20 = std::
                                 __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                           (xpans.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            xpans.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish,
                                            &psVar33[-8].field_2),
                       _Var20._M_current !=
                       xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish)) goto LAB_001f4262;
                  }
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::~basic_json(&ba_2);
                }
                else {
                  Console::Write(psVar33,kRed);
                }
              }
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump(&local_4708,&baJson,4,' ',false,strict);
              Value::Value((Value *)&ba_2,&local_4708);
              Value::operator=(__return_storage_ptr__,(Value *)&ba_2);
              Value::~Value((Value *)&ba_2);
              psVar30 = &local_4708;
            }
            else {
              SVar8 = persistent_storage::Registry::GetNetworkXpansByAliases
                                ((local_4890->mRegistry).
                                 super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,(StringArray *)local_4890,&xpans,(StringArray *)&agents);
              pBVar32 = agents.
                        super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (SVar8 == kSuccess) {
                psVar33 = (string *)(local_4578 + 0x20);
                for (pBVar26 = agents.
                               super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                               ._M_impl.super__Vector_impl_data._M_start; pBVar26 != pBVar32;
                    pBVar26 = (pointer)((pBVar26->mAddr).field_2._M_local_buf + 8)) {
                  std::__cxx11::string::string((string *)psVar33,(string *)pBVar26);
                  pIVar29 = (Interpreter *)local_4578;
                  std::__cxx11::string::string
                            ((string *)local_4578,"failed to resolve",(allocator *)&ba_2);
                  PrintNetworkMessage(pIVar29,psVar33,(string *)local_4578,kYellow);
                  std::__cxx11::string::~string((string *)local_4578);
                  std::__cxx11::string::~string((string *)psVar33);
                }
                if (xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish) goto LAB_001f41df;
                local_4888._0_8_ = local_4888._0_8_ & 0xffffffff00000000;
                local_4888._8_8_ =
                     "No known extended PAN ID discovered for network aliases. Please make complete rescan."
                ;
                local_4888._16_8_ = (char *)0x55;
                local_4888._24_8_ = 0;
                local_4860 = (parse_func)0x0;
                pcVar16 = 
                "No known extended PAN ID discovered for network aliases. Please make complete rescan."
                ;
                local_4888._32_8_ =
                     (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_4888;
                write_16.handler_ = (format_string_checker<char> *)local_4888;
                while (pcVar16 != "") {
                  cVar1 = *pcVar16;
                  pcVar21 = pcVar16;
                  while (cVar1 != '{') {
                    pcVar21 = pcVar21 + 1;
                    if (pcVar21 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>
                      ::writer::operator()(&write_16,pcVar16,"");
                      goto LAB_001f43ed;
                    }
                    cVar1 = *pcVar21;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()(&write_16,pcVar16,pcVar21);
                  pcVar16 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                      (pcVar21,"",(format_string_checker<char> *)local_4888);
                }
LAB_001f43ed:
                args_25.field_1.args_ = aVar31.args_;
                args_25.desc_ = (unsigned_long_long)local_4888;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&unresolved,
                           (v10 *)
                           "No known extended PAN ID discovered for network aliases. Please make complete rescan."
                           ,(string_view)ZEXT816(0x55),args_25);
                psVar25 = (string *)(local_4470 + 8);
                local_4470._0_4_ = kNotFound;
                std::__cxx11::string::string(psVar25,(string *)&unresolved);
                Value::Value((Value *)&ba_2,(Error *)local_4470);
              }
              else {
                local_4888._0_8_ = local_4888._0_8_ & 0xffffffff00000000;
                local_4888._8_8_ = "Failed to convert network aliases to XPAN IDs";
                local_4888._16_8_ = (char *)0x2d;
                local_4888._24_8_ = 0;
                local_4860 = (parse_func)0x0;
                pcVar16 = "Failed to convert network aliases to XPAN IDs";
                local_4888._32_8_ =
                     (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_4888;
                write_16.handler_ = (format_string_checker<char> *)local_4888;
                while (pcVar16 != "") {
                  cVar1 = *pcVar16;
                  pcVar21 = pcVar16;
                  while (cVar1 != '{') {
                    pcVar21 = pcVar21 + 1;
                    if (pcVar21 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>
                      ::writer::operator()(&write_16,pcVar16,"");
                      goto LAB_001f402e;
                    }
                    cVar1 = *pcVar21;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()(&write_16,pcVar16,pcVar21);
                  pcVar16 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                      (pcVar21,"",(format_string_checker<char> *)local_4888);
                }
LAB_001f402e:
                args_23.field_1.args_ = aVar31.args_;
                args_23.desc_ = (unsigned_long_long)local_4888;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&unresolved,
                           (v10 *)"Failed to convert network aliases to XPAN IDs",
                           (string_view)ZEXT816(0x2d),args_23);
                psVar25 = (string *)(local_4448 + 8);
                local_4448._0_4_ = 0x12;
                std::__cxx11::string::string(psVar25,(string *)&unresolved);
                Value::Value((Value *)&ba_2,(Error *)local_4448);
              }
              Value::operator=(__return_storage_ptr__,(Value *)&ba_2);
              Value::~Value((Value *)&ba_2);
              std::__cxx11::string::~string(psVar25);
              psVar30 = (string_t *)&unresolved;
            }
            std::__cxx11::string::~string((string *)psVar30);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&agents);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            goto LAB_001f3c9a;
          }
          do {
            sVar18 = read(local_4890->mCancelPipe[0],&xpans,4);
          } while (sVar18 != -1);
          local_4888._0_8_ = local_4888._0_8_ & 0xffffffff00000000;
          local_4888._8_8_ = "Scan cancelled by user";
          local_4888._16_8_ = (char *)0x16;
          local_4888._24_8_ = 0;
          local_4860 = (parse_func)0x0;
          pcVar16 = "Scan cancelled by user";
          local_4888._32_8_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4888;
          while (pcVar21 = pcVar16, pcVar21 != "") {
            pcVar16 = pcVar21 + 1;
            if (*pcVar21 == '}') {
              if ((pcVar16 == "") || (*pcVar16 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar16 = pcVar21 + 2;
            }
            else if (*pcVar21 == '{') {
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar21,"",(format_string_checker<char> *)local_4888);
            }
          }
          args_19.field_1.args_ = aVar31.args_;
          args_19.desc_ = (unsigned_long_long)local_4888;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&unresolved,(v10 *)"Scan cancelled by user",
                     (string_view)ZEXT816(0x16),args_19);
          psVar25 = (string *)(local_4420 + 8);
          local_4420._0_4_ = kCancelled;
          std::__cxx11::string::string(psVar25,(string *)&unresolved);
          Value::Value((Value *)&ba_2,(Error *)local_4420);
        }
        else {
          event_base_loopbreak(event_base);
          std::thread::join();
          local_4888._0_8_ = local_4888._0_8_ & 0xffffffff00000000;
          local_4888._8_8_ = "Sending mDNS query failed";
          local_4888._16_8_ = (char *)0x19;
          local_4888._24_8_ = 0;
          local_4860 = (parse_func)0x0;
          pcVar16 = "Sending mDNS query failed";
          local_4888._32_8_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_4888;
          while (pcVar21 = pcVar16, pcVar21 != "") {
            pcVar16 = pcVar21 + 1;
            if (*pcVar21 == '}') {
              if ((pcVar16 == "") || (*pcVar16 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar16 = pcVar21 + 2;
            }
            else if (*pcVar21 == '{') {
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar21,"",(format_string_checker<char> *)local_4888);
            }
          }
          args_10.field_1.args_ = aVar31.args_;
          args_10.desc_ = (unsigned_long_long)local_4888;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&unresolved,(v10 *)"Sending mDNS query failed",
                     (string_view)ZEXT816(0x19),args_10);
          psVar25 = (string *)(local_43f8 + 8);
          local_43f8._0_4_ = kIOError;
          std::__cxx11::string::string(psVar25,(string *)&unresolved);
          Value::Value((Value *)&ba_2,(Error *)local_43f8);
        }
      }
      else {
        local_4888._0_8_ = (pointer)0xc0000000d;
        local_4888._8_8_ = "failed to bind network interface {}: {}";
        local_4888._16_8_ = 0x27;
        local_4888._24_8_ = 0x200000000;
        local_4860 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_4858 = ::fmt::v10::detail::
                     parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
        pcVar16 = "failed to bind network interface {}: {}";
        local_4888._32_8_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4888;
        xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_4888;
        while (pcVar16 != "") {
          cVar1 = *pcVar16;
          pcVar21 = pcVar16;
          while (cVar1 != '{') {
            pcVar21 = pcVar21 + 1;
            if (pcVar21 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
              ::writer::operator()((writer *)&xpans,pcVar16,"");
              goto LAB_001f32f3;
            }
            cVar1 = *pcVar21;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
          ::writer::operator()((writer *)&xpans,pcVar16,pcVar21);
          pcVar16 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                              (pcVar21,"",
                               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_4888);
        }
LAB_001f32f3:
        piVar17 = __errno_location();
        local_4888._16_8_ = strerror(*piVar17);
        local_4888._0_8_ =
             networks.
             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_4888._8_8_ =
             networks.
             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        fmt_00.size_ = 0xcd;
        fmt_00.data_ = (char *)0x27;
        args_12.field_1.args_ = in_R9.args_;
        args_12.desc_ = (unsigned_long_long)local_4888;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&unresolved,(v10 *)"failed to bind network interface {}: {}",fmt_00,
                   args_12);
        psVar25 = (string *)(local_43d0 + 8);
        local_43d0._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(psVar25,(string *)&unresolved);
        Value::Value((Value *)&ba_2,(Error *)local_43d0);
      }
LAB_001f3c6b:
      Value::operator=(__return_storage_ptr__,(Value *)&ba_2);
      Value::~Value((Value *)&ba_2);
      std::__cxx11::string::~string(psVar25);
      std::__cxx11::string::~string((string *)&unresolved);
    }
    else {
      if (_Var14._M_current + 1 == pbVar28) {
        local_4888._0_8_ = local_4888._0_8_ & 0xffffffff00000000;
        local_4888._8_8_ = "Missing --timeout value";
        local_4888._16_8_ = (char *)0x17;
        local_4888._24_8_ = 0;
        local_4860 = (parse_func)0x0;
        pcVar16 = "Missing --timeout value";
        local_4888._32_8_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_4888;
        while (pcVar21 = pcVar16, pcVar21 != "") {
          pcVar16 = pcVar21 + 1;
          if (*pcVar21 == '}') {
            if ((pcVar16 == "") || (*pcVar16 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar16 = pcVar21 + 2;
          }
          else if (*pcVar21 == '{') {
            pcVar16 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar21,"",(format_string_checker<char> *)local_4888);
          }
        }
        args_07.field_1.values_ = in_R9.values_;
        args_07.desc_ = (unsigned_long_long)local_4888;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&unresolved,(v10 *)"Missing --timeout value",(string_view)ZEXT816(0x17)
                   ,args_07);
        psVar25 = (string *)(local_4358 + 8);
        local_4358._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(psVar25,(string *)&unresolved);
        Value::Value((Value *)&ba_2,(Error *)local_4358);
        goto LAB_001f3c6b;
      }
      utils::ParseInteger<unsigned_int>((Error *)local_4688,&scanTimeout,_Var14._M_current + 1);
      Value::Value((Value *)&ba_2,(Error *)local_4688);
      pVVar15 = Value::operator=(__return_storage_ptr__,(Value *)&ba_2);
      EVar2 = (pVVar15->mError).mCode;
      Value::~Value((Value *)&ba_2);
      std::__cxx11::string::~string((string *)(local_4688 + 8));
      if (EVar2 == kNone) {
        pbVar28 = (local_4890->mContext).mCommandKeys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_001f1e72;
      }
    }
LAB_001f3c9a:
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&baJson);
    std::
    vector<ot::commissioner::BorderAgentOrErrorMsg,_std::allocator<ot::commissioner::BorderAgentOrErrorMsg>_>
    ::~vector((vector<ot::commissioner::BorderAgentOrErrorMsg,_std::allocator<ot::commissioner::BorderAgentOrErrorMsg>_>
               *)&json);
    std::unique_ptr<event,_void_(*)(event_*)>::~unique_ptr(&cancelEvent);
    std::unique_ptr<event,_void_(*)(event_*)>::~unique_ptr
              ((unique_ptr<event,_void_(*)(event_*)> *)&write);
    std::thread::~thread(&selectThread);
    anon_unknown_34::FDGuard::~FDGuard(&fdgMdnsSocket);
    std::__cxx11::string::~string((string *)&networks);
    psVar25 = (string *)&routers;
    goto LAB_001f3cfd;
  }
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)routers.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_4800;
  routers.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4800._M_local_buf[0] = '\0';
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&networks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)networks.
                        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&json_1,(nullptr_t)0x0);
  agents.
  super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  agents.
  super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  agents.
  super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar19 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)(aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19;
  if (uVar12 < 0x41) {
    ba_2._0_8_ = (ulong)(uint)ba_2._4_4_ << 0x20;
    ba_2.m_value.object = (object_t *)anon_var_dwarf_2a4710;
    local_48c0._M_allocated_capacity = 0;
    local_48b0 = (code *)0x0;
    pcVar16 = "input JSON file path required";
    local_48c0._8_8_ = (pointer)&ba_2;
    while (pcVar21 = pcVar16, pcVar21 != "") {
      pcVar16 = pcVar21 + 1;
      if (*pcVar21 == '}') {
        if ((pcVar16 == "") || (*pcVar16 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar16 = pcVar21 + 2;
      }
      else if (*pcVar21 == '{') {
        pcVar16 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar21,"",(format_string_checker<char> *)&ba_2);
      }
    }
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&ba_2;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_4888,(v10 *)"input JSON file path required",
               (string_view)ZEXT816(0x1d),args_01);
    psVar25 = (string *)(local_4100 + 8);
    local_4100._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(psVar25,(string *)local_4888);
    Value::Value((Value *)&domNetworks,(Error *)local_4100);
LAB_001f2241:
    Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
    Value::~Value((Value *)&domNetworks);
LAB_001f2261:
    std::__cxx11::string::~string(psVar25);
    psVar25 = (string *)local_4888;
  }
  else {
    if (uVar12 != 0x60) {
      ba_2._0_8_ = (ulong)(uint)ba_2._4_4_ << 0x20;
      ba_2.m_value.object = (object_t *)anon_var_dwarf_2a462f;
      local_48c0._M_allocated_capacity = 0;
      local_48b0 = (code *)0x0;
      pcVar16 = "too many arguments";
      local_48c0._8_8_ = (pointer)&ba_2;
      while (pcVar21 = pcVar16, pcVar21 != "") {
        pcVar16 = pcVar21 + 1;
        if (*pcVar21 == '}') {
          if ((pcVar16 == "") || (*pcVar16 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar16 = pcVar21 + 2;
        }
        else if (*pcVar21 == '{') {
          pcVar16 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar21,"",(format_string_checker<char> *)&ba_2);
        }
      }
      args_03.field_1.values_ = in_R9.values_;
      args_03.desc_ = (unsigned_long_long)&ba_2;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_4888,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_03
                );
      psVar25 = (string *)(local_4128 + 8);
      local_4128._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(psVar25,(string *)local_4888);
      Value::Value((Value *)&domNetworks,(Error *)local_4128);
      goto LAB_001f2241;
    }
    JsonFromFile((Error *)&domNetworks,(string *)&networks,pbVar19 + 2);
    pEVar13 = Error::operator=((Error *)&routers,(Error *)&domNetworks);
    ba_2._0_8_ = (ulong)(uint)ba_2._4_4_ << 0x20;
    ba_2.m_value.object = (object_t *)&local_48c0;
    local_48c0._M_allocated_capacity = local_48c0._M_allocated_capacity & 0xffffffffffffff00;
    EVar2 = pEVar13->mCode;
    std::__cxx11::string::~string((string *)&ba_2.m_value.boolean);
    std::__cxx11::string::~string
              ((string *)
               &domNetworks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    if (EVar2 == kNone) {
      nlohmann::detail::input_adapter::
      input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((input_adapter *)&domNetworks,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&networks);
      local_4628 = 0;
      uStack_4620 = 0;
      local_4638._M_unused._M_object = (void *)0x0;
      local_4638._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse(&local_46e8,(input_adapter *)&domNetworks,(parser_callback_t *)&local_4638,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(&json_1,&local_46e8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_46e8);
      std::_Function_base::~_Function_base((_Function_base *)&local_4638);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &domNetworks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (json_1.m_type == array) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::begin((iterator *)&unresolved,&json_1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::end((iterator *)&json,&json_1);
        while (bVar7 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator!=((iterator *)&unresolved,(iterator *)&json), bVar7) {
          aJson = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iterator *)&unresolved);
          BorderAgent::BorderAgent((BorderAgent *)&domNetworks);
          BorderAgentFromJson((BorderAgent *)&domNetworks,aJson);
          std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
          ::push_back(&agents,(BorderAgent *)&domNetworks);
          BorderAgent::~BorderAgent((BorderAgent *)&domNetworks);
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iterator *)&unresolved);
        }
      }
      else {
        BorderAgent::BorderAgent((BorderAgent *)&domNetworks);
        BorderAgentFromJson((BorderAgent *)&domNetworks,&json_1);
        std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>::
        push_back(&agents,(value_type *)&domNetworks);
        BorderAgent::~BorderAgent((BorderAgent *)&domNetworks);
      }
      pBVar26 = agents.
                super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (pBVar32 = agents.
                     super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pBVar32 !=
          agents.
          super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
          ._M_impl.super__Vector_impl_data._M_finish; pBVar32 = pBVar32 + 1) {
        if ((~pBVar32->mPresentFlags & 0x3f) != 0) {
          ba_2.m_type = array;
          ba_2._1_7_ = 0x2000000;
          ba_2.m_value.object = (object_t *)anon_var_dwarf_2a50c1;
          local_48c0._M_allocated_capacity = 0x200000000;
          local_48c0._8_8_ = &ba_2;
          local_48b0 = ::fmt::v10::detail::
                       parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_48a8 = ::fmt::v10::detail::
                       parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar16 = 
          "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})";
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48c0._8_8_;
          while (pcVar16 != "") {
            cVar1 = *pcVar16;
            pcVar21 = pcVar16;
            while (cVar1 != '{') {
              pcVar21 = pcVar21 + 1;
              if (pcVar21 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int>_>
                ::writer::operator()((writer *)&unresolved,pcVar16,"");
                goto LAB_001f3448;
              }
              cVar1 = *pcVar21;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int>_>
            ::writer::operator()((writer *)&unresolved,pcVar16,pcVar21);
            pcVar16 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int,unsigned_int>&>
                                (pcVar21,"",
                                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&ba_2);
          }
LAB_001f3448:
          ba_2._0_8_ = ZEXT48(pBVar32->mPresentFlags);
          fmt_01.size_ = 0x22;
          fmt_01.data_ = (char *)0x4f;
          args_13.field_1.values_ = in_R9.values_;
          args_13.desc_ = (unsigned_long_long)&ba_2;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_4888,
                     (v10 *)
                     "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})"
                     ,fmt_01,args_13);
          psVar25 = (string *)(local_41c8 + 8);
          local_41c8._0_4_ = kRejected;
          std::__cxx11::string::string(psVar25,(string *)local_4888);
          Value::Value((Value *)&domNetworks,(Error *)local_41c8);
          goto LAB_001f2241;
        }
        if (pBVar32->mExtendedPanId == 0) {
          ba_2.m_type = discarded|number_integer;
          ba_2._1_7_ = 0x2000000;
          ba_2.m_value.object = (object_t *)anon_var_dwarf_2a50da;
          local_48c0._M_allocated_capacity = 0x200000000;
          local_48c0._8_8_ = &ba_2;
          local_48b0 = ::fmt::v10::detail::
                       parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_48a8 = ::fmt::v10::detail::
                       parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar16 = "XPAN required but not provided for border agent host:port {}:{}";
          unresolved.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48c0._8_8_;
          while (pcVar16 != "") {
            cVar1 = *pcVar16;
            pcVar21 = pcVar16;
            while (cVar1 != '{') {
              pcVar21 = pcVar21 + 1;
              if (pcVar21 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                ::writer::operator()((writer *)&unresolved,pcVar16,"");
                goto LAB_001f34c4;
              }
              cVar1 = *pcVar21;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
            ::writer::operator()((writer *)&unresolved,pcVar16,pcVar21);
            pcVar16 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                                (pcVar21,"",
                                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&ba_2);
          }
LAB_001f34c4:
          ba_2._0_8_ = (pBVar32->mAddr)._M_dataplus._M_p;
          ba_2.m_value = (json_value)(pBVar32->mAddr)._M_string_length;
          fmt_02.size_ = 0x2d;
          fmt_02.data_ = (char *)0x3f;
          args_14.field_1.args_ = in_R9.args_;
          args_14.desc_ = (unsigned_long_long)&ba_2;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_4888,
                     (v10 *)"XPAN required but not provided for border agent host:port {}:{}",fmt_02
                     ,args_14);
          psVar25 = (string *)(local_41f0 + 8);
          local_41f0._0_4_ = kRejected;
          std::__cxx11::string::string(psVar25,(string *)local_4888);
          Value::Value((Value *)&domNetworks,(Error *)local_41f0);
          goto LAB_001f2241;
        }
        json._0_8_ = json._0_8_ & 0xffffffffffffff00;
        domNetworks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&json;
        lVar35 = (long)pBVar26 -
                 (long)agents.
                       super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        __it._M_current =
             agents.
             super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
             ._M_impl.super__Vector_impl_data._M_start;
        domNetworks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pBVar32;
        for (lVar23 = ((long)pBVar32 -
                      (long)agents.
                            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x178 >> 2;
            _Var27._M_current = __it._M_current, 0 < lVar23; lVar23 = lVar23 + -1) {
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                  ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                *)&domNetworks,__it);
          if (bVar7) goto LAB_001f2b83;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                  ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                *)&domNetworks,__it._M_current + 1);
          _Var27._M_current = __it._M_current + 1;
          if (bVar7) goto LAB_001f2b83;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                  ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                *)&domNetworks,__it._M_current + 2);
          _Var27._M_current = __it._M_current + 2;
          if (bVar7) goto LAB_001f2b83;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                  ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                *)&domNetworks,__it._M_current + 3);
          _Var27._M_current = __it._M_current + 3;
          if (bVar7) goto LAB_001f2b83;
          __it._M_current = __it._M_current + 4;
          lVar35 = lVar35 + -0x5e0;
        }
        lVar35 = lVar35 / 0x178;
        if (lVar35 == 1) {
LAB_001f2bc7:
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                  ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                *)&domNetworks,__it);
          _Var27._M_current = __it._M_current;
          if (!bVar7) {
            _Var27._M_current = pBVar32;
          }
LAB_001f2b83:
          if (_Var27._M_current == pBVar32) goto LAB_001f2b8c;
          if ((json._0_8_ & 1) != 0) {
            ba_2.m_type = discarded|number_integer;
            ba_2._1_7_ = 0x2000000;
            ba_2.m_value.object = (object_t *)anon_var_dwarf_2a50e7;
            local_48c0._M_allocated_capacity = 0x200000000;
            local_48c0._8_8_ = &ba_2;
            local_48b0 = ::fmt::v10::detail::
                         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_48a8 = ::fmt::v10::detail::
                         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>
            ;
            psVar25 = (string *)(local_45a0 + 8);
            pcVar16 = "Address {} and port {} combination is not unique for inbound border agents";
            unresolved.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48c0._8_8_;
            while (pcVar16 != "") {
              cVar1 = *pcVar16;
              pcVar21 = pcVar16;
              while (cVar1 != '{') {
                pcVar21 = pcVar21 + 1;
                if (pcVar21 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                  ::writer::operator()((writer *)&unresolved,pcVar16,"");
                  goto LAB_001f3986;
                }
                cVar1 = *pcVar21;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
              ::writer::operator()((writer *)&unresolved,pcVar16,pcVar21);
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                                  (pcVar21,"",
                                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&ba_2);
            }
LAB_001f3986:
            ba_2._0_8_ = (pBVar32->mAddr)._M_dataplus._M_p;
            ba_2.m_value = (json_value)(pBVar32->mAddr)._M_string_length;
            fmt_04.size_ = 0x2d;
            fmt_04.data_ = (char *)0x4a;
            args_16.field_1.values_ = in_R9.values_;
            args_16.desc_ = (unsigned_long_long)&ba_2;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4888,
                       (v10 *)
                       "Address {} and port {} combination is not unique for inbound border agents",
                       fmt_04,args_16);
            local_45a0._0_4_ = kRejected;
            std::__cxx11::string::string(psVar25,(string *)local_4888);
            Value::Value((Value *)&domNetworks,(Error *)local_45a0);
            goto LAB_001f39e3;
          }
          if ((json._0_8_ & 2) == 0) {
            if ((json._0_8_ & 4) == 0) goto LAB_001f2270;
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0xd00000004;
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(domNetworks.
                                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,0xd);
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_2a510d;
            pcVar16 = 
            "Two inbound border agents have same XPAN \'{}\', but different domain names (\'{}\' and \'{}\')"
            ;
            unresolved.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&domNetworks;
            while (pcVar16 != "") {
              cVar1 = *pcVar16;
              pcVar21 = pcVar16;
              while (cVar1 != '{') {
                pcVar21 = pcVar21 + 1;
                if (pcVar21 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&unresolved,pcVar16,"");
                  goto LAB_001f40c3;
                }
                cVar1 = *pcVar21;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&unresolved,pcVar16,pcVar21);
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,std::__cxx11::string,std::__cxx11::string>&>
                                  (pcVar21,"",
                                   (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&domNetworks);
            }
LAB_001f40c3:
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar32->mExtendedPanId;
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pBVar32->mDomainName)._M_dataplus._M_p;
            fmt_10.size_ = 0xdd4;
            fmt_10.data_ = (char *)0x59;
            args_24.field_1.args_ = in_R9.args_;
            args_24.desc_ = (unsigned_long_long)&domNetworks;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4888,
                       (v10 *)
                       "Two inbound border agents have same XPAN \'{}\', but different domain names (\'{}\' and \'{}\')"
                       ,fmt_10,args_24);
            local_45f0._0_4_ = kRejected;
            psVar25 = (string *)(local_45f0 + 8);
            std::__cxx11::string::string(psVar25,(string *)local_4888);
            Value::Value((Value *)&ba_2,(Error *)local_45f0);
          }
          else {
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0xd00000004;
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)CONCAT44(domNetworks.
                                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,0xd);
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_2a5100;
            pcVar16 = 
            "Two inbound border agents have same XPAN \'{}\', but different network names (\'{}\' and \'{}\')"
            ;
            unresolved.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&domNetworks;
            while (pcVar16 != "") {
              cVar1 = *pcVar16;
              pcVar21 = pcVar16;
              while (cVar1 != '{') {
                pcVar21 = pcVar21 + 1;
                if (pcVar21 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)&unresolved,pcVar16,"");
                  goto LAB_001f3fa0;
                }
                cVar1 = *pcVar21;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)&unresolved,pcVar16,pcVar21);
              pcVar16 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,std::__cxx11::string,std::__cxx11::string>&>
                                  (pcVar21,"",
                                   (format_string_checker<char,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&domNetworks);
            }
LAB_001f3fa0:
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar32->mExtendedPanId;
            domNetworks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pBVar32->mNetworkName)._M_dataplus._M_p;
            fmt_09.size_ = 0xdd4;
            fmt_09.data_ = (char *)0x5a;
            args_22.field_1.values_ = in_R9.values_;
            args_22.desc_ = (unsigned_long_long)&domNetworks;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4888,
                       (v10 *)
                       "Two inbound border agents have same XPAN \'{}\', but different network names (\'{}\' and \'{}\')"
                       ,fmt_09,args_22);
            local_45c8._0_4_ = kRejected;
            psVar25 = (string *)(local_45c8 + 8);
            std::__cxx11::string::string(psVar25,(string *)local_4888);
            Value::Value((Value *)&ba_2,(Error *)local_45c8);
          }
          Value::operator=(__return_storage_ptr__,(Value *)&ba_2);
          Value::~Value((Value *)&ba_2);
          goto LAB_001f2261;
        }
        if (lVar35 == 2) {
LAB_001f2ba4:
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                  ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                *)&domNetworks,__it);
          _Var27._M_current = __it._M_current;
          if (!bVar7) {
            __it._M_current = __it._M_current + 1;
            goto LAB_001f2bc7;
          }
          goto LAB_001f2b83;
        }
        if (lVar35 == 3) {
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_31>
                  ::operator()((_Iter_pred<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                                *)&domNetworks,__it);
          if (!bVar7) {
            __it._M_current = __it._M_current + 1;
            goto LAB_001f2ba4;
          }
          goto LAB_001f2b83;
        }
LAB_001f2b8c:
        pBVar26 = pBVar26 + 1;
      }
      psVar25 = (string *)(local_4618 + 8);
      pBVar26 = agents.
                super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_001f2ff3:
      if (pBVar26 != pBVar32) {
        SVar8 = persistent_storage::Registry::Add
                          ((local_4890->mRegistry).
                           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,pBVar26);
        if (SVar8 == kSuccess) goto code_r0x001f3018;
        ba_2.m_type = discarded|number_integer;
        ba_2._1_7_ = 0x2000000;
        ba_2.m_value.object = (object_t *)anon_var_dwarf_2a5126;
        local_48c0._M_allocated_capacity = 0x200000000;
        local_48b0 = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_48a8 = ::fmt::v10::detail::
                     parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar16 = "Insertion failure with border agent address {} and port {}";
        local_48c0._8_8_ = (pointer)&ba_2;
        unresolved.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&ba_2;
        while (pcVar16 != "") {
          cVar1 = *pcVar16;
          pcVar21 = pcVar16;
          while (cVar1 != '{') {
            pcVar21 = pcVar21 + 1;
            if (pcVar21 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
              ::writer::operator()((writer *)&unresolved,pcVar16,"");
              goto LAB_001f37a3;
            }
            cVar1 = *pcVar21;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
          ::writer::operator()((writer *)&unresolved,pcVar16,pcVar21);
          pcVar16 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                              (pcVar21,"",
                               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&ba_2);
        }
LAB_001f37a3:
        ba_2._0_8_ = (pBVar26->mAddr)._M_dataplus._M_p;
        ba_2.m_value = (json_value)(pBVar26->mAddr)._M_string_length;
        fmt_03.size_ = 0x2d;
        fmt_03.data_ = (char *)0x3a;
        args_15.field_1.args_ = in_R9.args_;
        args_15.desc_ = (unsigned_long_long)&ba_2;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_4888,
                   (v10 *)"Insertion failure with border agent address {} and port {}",fmt_03,
                   args_15);
        local_4618._0_4_ = kRegistryError;
        std::__cxx11::string::string(psVar25,(string *)local_4888);
        Value::Value((Value *)&domNetworks,(Error *)local_4618);
LAB_001f39e3:
        Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
        Value::~Value((Value *)&domNetworks);
        goto LAB_001f2261;
      }
      goto LAB_001f2270;
    }
    Error::Error((Error *)local_4660,(Error *)&routers);
    Value::Value((Value *)&domNetworks,(Error *)local_4660);
    Value::operator=(__return_storage_ptr__,(Value *)&domNetworks);
    Value::~Value((Value *)&domNetworks);
    psVar25 = (string *)(local_4660 + 8);
  }
  std::__cxx11::string::~string(psVar25);
LAB_001f2270:
  std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>::
  ~vector(&agents);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json_1);
  std::__cxx11::string::~string((string *)&networks);
  psVar25 = (string *)
            &routers.
             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ._M_impl.super__Vector_impl_data._M_finish;
LAB_001f3cfd:
  std::__cxx11::string::~string(psVar25);
  return __return_storage_ptr__;
code_r0x001f3018:
  pBVar26 = pBVar26 + 1;
  goto LAB_001f2ff3;
}

Assistant:

Interpreter::Value Interpreter::ProcessBr(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        nlohmann::json            json;
        std::vector<BorderRouter> routers;
        std::vector<Network>      networks;
        RegistryStatus            status;

        VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        if (mContext.mDomAliases.size() > 0)
        {
            for (const auto &dom : mContext.mDomAliases)
            {
                std::vector<Network> domNetworks;
                status = mRegistry->GetNetworksInDomain(dom, domNetworks);
                if (status != RegistryStatus::kSuccess)
                {
                    PrintNetworkMessage(dom, "domain name unknown", COLOR_ALIAS_FAILED);
                }
                else
                {
                    networks.insert(networks.end(), domNetworks.begin(), domNetworks.end());
                }
            }
        }
        else if (mContext.mNwkAliases.size() > 0)
        {
            StringArray unresolved;
            status = mRegistry->GetNetworksByAliases(mContext.mNwkAliases, networks, unresolved);
            // no need to announce unresolved items here as those were
            // displayed in the course of ValidateMultiNetworkSyntax()
            VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
        }
        else
        {
            status = mRegistry->GetAllBorderRouters(routers);
            if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
            }
        }
        if (networks.size() > 0)
        {
            for (const auto &nwk : networks)
            {
                std::vector<BorderRouter> nwkRouters;
                status = mRegistry->GetBorderRoutersInNetwork(nwk.mXpan, nwkRouters);
                if (status == RegistryStatus::kSuccess)
                {
                    routers.insert(routers.end(), nwkRouters.begin(), nwkRouters.end());
                }
                else
                {
                    PrintNetworkMessage(nwk.mXpan, RUNTIME_LOOKUP_FAILED, COLOR_ALIAS_FAILED);
                }
            }
        }
        if (routers.size() > 0)
        {
            json  = routers;
            value = json.dump(JSON_INDENT_DEFAULT);
        }
        else
        {
            value = Value("[]");
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "add"))
    {
        Error                    error;
        std::string              jsonStr;
        nlohmann::json           json;
        std::vector<BorderAgent> agents;

        if (aExpr.size() < 3)
        {
            ExitNow(value = ERROR_INVALID_ARGS("input JSON file path required"));
        }
        else if (aExpr.size() > 3)
        {
            ExitNow(value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        }

        VerifyOrExit((error = JsonFromFile(jsonStr, aExpr[2])) == ERROR_NONE, value = Value(error));

        try
        {
            json = nlohmann::json::parse(jsonStr);
        } catch (std::exception &e)
        {
            ExitNow(value = ERROR_BAD_FORMAT("failed to parse JSON: {}", e.what()));
        }

        // Can be either single BorderAgent or an array of them.
        if (!json.is_array())
        {
            // Parse single BorderAgent
            BorderAgent ba;
            try
            {
                BorderAgentFromJson(ba, json);
            } catch (std::exception &e)
            {
                ExitNow(value = ERROR_BAD_FORMAT("incorrect border agent JSON format: {}", e.what()));
            }
            agents.push_back(ba);
        }
        else
        {
            for (const auto &jsonObject : json)
            {
                BorderAgent ba;
                try
                {
                    BorderAgentFromJson(ba, jsonObject);
                } catch (std::exception &e)
                {
                    ExitNow(value = ERROR_BAD_FORMAT("incorrect border agent JSON format: {}", e.what()));
                }
                agents.push_back(ba);
            }
        }
        // Sanity check of BorderAgent records
        for (auto iter = agents.begin(); iter != agents.end(); ++iter)
        {
            // Check mandatory fields present
            // By Thread 1.1.1 spec table 8-4
            constexpr const uint32_t kMandatoryFieldsBits =
                (BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kThreadVersionBit |
                 BorderAgent::kStateBit | BorderAgent::kNetworkNameBit | BorderAgent::kExtendedPanIdBit);
            if ((iter->mPresentFlags & kMandatoryFieldsBits) != kMandatoryFieldsBits)
            {
                ExitNow(value = ERROR_REJECTED(
                            "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})",
                            iter->mPresentFlags, kMandatoryFieldsBits));
            }

            // Check local network information sanity
            constexpr const uint32_t kNetworkInfoBits =
                (BorderAgent::kExtendedPanIdBit | BorderAgent::kNetworkNameBit | BorderAgent::kDomainNameBit);
            if (((iter->mPresentFlags & kNetworkInfoBits) != 0) &&
                (((iter->mPresentFlags & BorderAgent::kExtendedPanIdBit) == 0) || (iter->mExtendedPanId == 0)))
            {
                ExitNow(value = ERROR_REJECTED("XPAN required but not provided for border agent host:port {}:{}",
                                               iter->mAddr, iter->mPort));
            }

            // Sanity check across inbound data
            if (iter->mPresentFlags & BorderAgent::kExtendedPanIdBit)
            {
                struct
                {
                    bool addr : 1;
                    bool name : 1;
                    bool domain : 1;
                } flags = {false, false, false};

                // Network: (XPAN, PAN) combination must be same everywhere
                std::vector<BorderAgent>::iterator found =
                    std::find_if(agents.begin(), iter, [=, &flags](BorderAgent a) {
                        flags.addr = (iter->mAddr == a.mAddr && iter->mPort == a.mPort);
                        if (flags.addr)
                        {
                            return true;
                        }

#define CHECK_PRESENT_FLAG(record, flag) ((record).mPresentFlags & BorderAgent::k##flag##Bit)
                        if (CHECK_PRESENT_FLAG(a, ExtendedPanId) == 0)
                        {
                            return false;
                        }
                        flags.name = (CHECK_PRESENT_FLAG(a, NetworkName) != CHECK_PRESENT_FLAG(*iter, NetworkName)) ||
                                     ((CHECK_PRESENT_FLAG(*iter, NetworkName) != 0) &&
                                      iter->mExtendedPanId == a.mExtendedPanId && iter->mNetworkName != a.mNetworkName);
                        flags.domain = (CHECK_PRESENT_FLAG(a, DomainName) && CHECK_PRESENT_FLAG(*iter, DomainName)) &&
                                       (iter->mExtendedPanId == a.mExtendedPanId && iter->mDomainName != a.mDomainName);
                        return flags.name || flags.domain;
#undef CHECK_PRESENT_FLAG
                    });
                if (found != iter)
                {
                    if (flags.addr)
                    {
                        value =
                            ERROR_REJECTED("Address {} and port {} combination is not unique for inbound border agents",
                                           iter->mAddr, iter->mPort);
                    }
                    else if (flags.name)
                    {
                        value = ERROR_REJECTED("Two inbound border agents have same XPAN '{}', but different network "
                                               "names ('{}' and '{}')",
                                               iter->mExtendedPanId, iter->mNetworkName, found->mNetworkName);
                    }
                    else if (flags.domain)
                    {
                        value = ERROR_REJECTED(
                            "Two inbound border agents have same XPAN '{}', but different domain names ('{}' and '{}')",
                            iter->mExtendedPanId, iter->mDomainName, found->mDomainName);
                    }
                    ExitNow();
                }
            }
        }

        for (const auto &agent : agents)
        {
            auto status = mRegistry->Add(agent);
            if (status != RegistryStatus::kSuccess)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR("Insertion failure with border agent address {} and port {}",
                                                     agent.mAddr, agent.mPort));
            }
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "delete"))
    {
        if (aExpr.size() > 3 || (aExpr.size() == 3 && !(mContext.mNwkAliases.empty() && mContext.mDomAliases.empty())))
        {
            ExitNow(value = ERROR_INVALID_ARGS("Too many arguments for `br delete` command`"));
        }
        else if (aExpr.size() == 3)
        {
            // Attempt to remove border agent by BorderRouterId
            BorderRouterId brId;
            try
            {
                brId = BorderRouterId(std::stoi(aExpr[2]));
            } catch (...)
            {
                ExitNow(value = ERROR_INVALID_ARGS("Failed to evaluate border router ID '{}'", aExpr[2]));
            }
            auto status = mRegistry->DeleteBorderRouterById(brId);
            if (status == RegistryStatus::kRestricted)
            {
                value = ERROR_REGISTRY_ERROR("Failed to delete border router ID {}: last router in the current network",
                                             aExpr[2]);
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value = ERROR_REGISTRY_ERROR("Failed to delete border router ID {}", aExpr[2]);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
        else if (mContext.mNwkAliases.size() > 0)
        {
            StringArray unresolved;
            // Remove all border agents in the networks
            auto status = mRegistry->DeleteBorderRoutersInNetworks(mContext.mNwkAliases, unresolved);
            if (status == RegistryStatus::kRestricted)
            {
                value = ERROR_REGISTRY_ERROR("Can't delete all border routers from the current network");
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value = Error(ErrorCode ::kIOError, "Failed to delete border routers");
            }
            // Report unresolved aliases
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
        else if (mContext.mDomAliases.size() > 0)
        {
            StringArray undeleted;
            // Remove all border agents in the domain
            auto status = mRegistry->DeleteBorderRoutersInDomain(mContext.mDomAliases[0]);
            if (status == RegistryStatus::kRestricted)
            {
                value =
                    ERROR_REGISTRY_ERROR("Failed to delete border routers in the domain '{}' of the current network",
                                         mContext.mDomAliases[0]);
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value =
                    ERROR_REGISTRY_ERROR("Failed to delete border routers in the domain '{}'", mContext.mDomAliases[0]);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "scan"))
    {
        constexpr const mdns_record_type_t kMdnsQueryType  = MDNS_RECORDTYPE_PTR;
        constexpr const uint32_t           kMdnsBufferSize = 16 * 1024;
        const std::string                  kServiceName    = "_meshcop._udp.local";

        uint32_t                                  scanTimeout = 10000;
        std::string                               netIf       = "";
        int                                       mdnsSocket  = -1;
        FDGuard                                   fdgMdnsSocket;
        std::thread                               selectThread;
        event_base                               *base;
        timeval                                   tvTimeout;
        std::unique_ptr<event, void (*)(event *)> mdnsEvent(nullptr, event_free);
        std::unique_ptr<event, void (*)(event *)> cancelEvent(nullptr, event_free);
        std::vector<BorderAgentOrErrorMsg>        borderAgents;
        nlohmann::json                            baJson;
        char                                      mdnsSendBuffer[kMdnsBufferSize];
        int                                       rval = 0;

        auto it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--timeout");
        if (it != mContext.mCommandKeys.end())
        {
            if (++it != mContext.mCommandKeys.end())
            {
                SuccessOrExit(value = ParseInteger(scanTimeout, it[0]));
            }
            else
            {
                ExitNow(value = ERROR_INVALID_ARGS("Missing --timeout value"));
            }
        }

        it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--netif");
        if (it != mContext.mCommandKeys.end())
        {
            if (++it != mContext.mCommandKeys.end())
            {
                netIf = it[0];
            }
            else
            {
                ExitNow(value = ERROR_INVALID_ARGS("Missing --netif value"));
            }
        }

        // Open IPv4 mDNS socket
        mdnsSocket = mdns_socket_open_ipv4();
        VerifyOrExit(mdnsSocket >= 0, value = ERROR_IO_ERROR("failed to open mDNS IPv4 socket"));

        if (!netIf.empty())
        {
#ifdef __linux__
            rval = setsockopt(mdnsSocket, SOL_SOCKET, SO_BINDTODEVICE, netIf.c_str(), netIf.size());
#else  // __NetBSD__ || __FreeBSD__ || __APPLE__
            rval = setsockopt(mdnsSocket, IPPROTO_IPV6, IP_BOUND_IF, netIf.c_str(), netIf.size());
#endif // __linux__
            VerifyOrExit(rval == 0,
                         value = ERROR_INVALID_ARGS("failed to bind network interface {}: {}", netIf, strerror(errno)));
        }

        fdgMdnsSocket.mFD = mdnsSocket;

        //  Initialize event library
        base = event_base_new();

        // Instantly register timeout event to stop the event loop
        evutil_timerclear(&tvTimeout);
        tvTimeout.tv_sec  = scanTimeout / 1000;
        tvTimeout.tv_usec = (scanTimeout % 1000) * 1000;
        event_base_loopexit(base, &tvTimeout);

        // Register event for inbound events on mdnsSocket
        // The mdnsSocket is already non-blocking (as we need for the event library)
        auto mdnsReaderParser = [](evutil_socket_t aSocket, short aWhat, void *aArg) {
            (void)aWhat;

            BorderAgentOrErrorMsg               agent;
            char                                buf[1024 * 16];
            std::vector<BorderAgentOrErrorMsg> &agents = *static_cast<std::vector<BorderAgentOrErrorMsg> *>(aArg);

            mdns_query_recv(aSocket, buf, sizeof(buf), HandleRecord, &agent, 1);
            agents.push_back(agent);

            return;
        };
        mdnsEvent = std::unique_ptr<event, void (*)(event *)>(
            event_new(base, mdnsSocket, EV_READ | EV_PERSIST, mdnsReaderParser, &borderAgents), event_free);
        event_add(mdnsEvent.get(), nullptr);

        // Stop event queue on data in the mCancelPipe
        auto mdnsCancelEventQueue = [](evutil_socket_t aSocket, short aWhat, void *aArg) {
            (void)aSocket;
            (void)aWhat;
            event_base *ev_base = static_cast<event_base *>(aArg);
            event_base_loopbreak(ev_base);
        };
        // Attach cancel pipe to event loop. When bytes written to the
        // pipe, mdnsCancelEventQueue() lambda is invoked resulting in
        // breaking event loop
        cancelEvent = std::unique_ptr<event, void (*)(event *)>(
            event_new(base, mCancelPipe[0], EV_READ | EV_PERSIST, mdnsCancelEventQueue, base), event_free);
        event_add(cancelEvent.get(), nullptr);

        // Start event loop thread
        selectThread = std::thread([](event_base *aBase) { event_base_dispatch(aBase); }, base);

        // Send mDNS query
        if (mdns_query_send(mdnsSocket, kMdnsQueryType, kServiceName.c_str(), kServiceName.length(), mdnsSendBuffer,
                            sizeof(mdnsSendBuffer)) != 0)
        {
            // Stop event thread
            event_base_loopbreak(base);
            selectThread.join();
            ExitNow(value = ERROR_IO_ERROR("Sending mDNS query failed"));
        }
        // Join the waiting (event loop) thread
        selectThread.join();

        if (mCancelCommand)
        {
            int cancelData;
            while (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) != -1)
                ;
            ExitNow(value = ERROR_CANCELLED("Scan cancelled by user"));
        }

        std::vector<uint64_t> xpans;
        StringArray           unresolved;
        if (!mContext.mNwkAliases.empty())
        {
            VerifyOrExit(mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, xpans, unresolved) ==
                             RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("Failed to convert network aliases to XPAN IDs"));
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(!xpans.empty(),
                         value = ERROR_NOT_FOUND(
                             "No known extended PAN ID discovered for network aliases. Please make complete rescan."));
        }

        // Serialize BorderAgents to JSON into value
        for (const auto &agentOrError : borderAgents)
        {
            if (agentOrError.mError != ErrorCode::kNone)
            {
                Console::Write(agentOrError.mError.GetMessage(), Console::Color::kRed);
            }
            else
            {
                nlohmann::json ba;
                BorderAgentToJson(agentOrError.mBorderAgent, ba);
                if ((mContext.mNwkAliases.empty() && mContext.mDomAliases.empty()) ||
                    (!mContext.mDomAliases.empty() &&
                     (agentOrError.mBorderAgent.mPresentFlags & BorderAgent::kDomainNameBit) &&
                     (agentOrError.mBorderAgent.mDomainName == mContext.mDomAliases[0])) ||
                    (!mContext.mNwkAliases.empty() &&
                     (agentOrError.mBorderAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) &&
                     (std::find(xpans.begin(), xpans.end(), agentOrError.mBorderAgent.mExtendedPanId) != xpans.end())))
                {
                    baJson.push_back(ba);
                }
            }
        }
        value = baJson.dump(JSON_INDENT_DEFAULT);
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}